

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O2

int binary::putUvarint(Bytes *buf,UInt val)

{
  byte *pbVar1;
  int i;
  size_type __n;
  
  __n = 0;
  while( true ) {
    if (val < 0x80) break;
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(buf,__n);
    *pbVar1 = (byte)val | 0x80;
    val = val >> 7;
    __n = __n + 1;
  }
  pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(buf,__n);
  *pbVar1 = (byte)val;
  return (int)__n + 1;
}

Assistant:

int putUvarint(Bytes &buf, UInt val) {
	int i{};
	unsigned char x{};

	while (val >= 0x80) {
		x = (unsigned char)(val);
		buf.at(i) = x | 0x80;
		val >>= 7;
		i++;
	}
	x = (unsigned char)(val);
	buf.at(i) = x;
	return i + 1;
}